

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::PolyOffsetBuilder::AddPoint(PolyOffsetBuilder *this,IntPoint *pt)

{
  long64 lVar1;
  pointer pIVar2;
  iterator __position;
  vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *this_00;
  
  this_00 = (vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this->m_curr_poly;
  __position._M_current = *(IntPoint **)(this_00 + 8);
  pIVar2 = *(pointer *)(this_00 + 0x10);
  if (__position._M_current == pIVar2) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)this_00,
               ((long)__position._M_current - *(long *)this_00 >> 4) + 0x80);
    this_00 = (vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this->m_curr_poly
    ;
    __position._M_current = *(IntPoint **)(this_00 + 8);
    pIVar2 = *(pointer *)(this_00 + 0x10);
  }
  if (__position._M_current != pIVar2) {
    lVar1 = pt->Y;
    (__position._M_current)->X = pt->X;
    (__position._M_current)->Y = lVar1;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
    return;
  }
  std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
  _M_realloc_insert<ClipperLib::IntPoint_const&>(this_00,__position,pt);
  return;
}

Assistant:

void AddPoint(const IntPoint& pt)
{
    Polygon::size_type len = m_curr_poly->size();
    if (len == m_curr_poly->capacity())
        m_curr_poly->reserve(len + buffLength);
    m_curr_poly->push_back(pt);
}